

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_push_constant_resources(Compiler *compiler,SmallVector<spirv_cross::Resource,_8UL> *res)

{
  uint uVar1;
  FILE *pFVar2;
  Resource *pRVar3;
  ulong uVar4;
  bool bVar5;
  undefined8 local_1e0;
  undefined8 local_1c0;
  string local_1a0 [36];
  uint32_t local_17c;
  string *local_178;
  string *name;
  BufferRange *range;
  BufferRange *__end2;
  BufferRange *__begin2;
  SmallVector<spirv_cross::BufferRange,_8UL> *__range2;
  uint local_13c;
  string local_138 [36];
  uint32_t local_114;
  undefined1 local_110 [8];
  SmallVector<spirv_cross::BufferRange,_8UL> ranges;
  Resource *block;
  Resource *__end1;
  Resource *__begin1;
  SmallVector<spirv_cross::Resource,_8UL> *__range1;
  SmallVector<spirv_cross::Resource,_8UL> *res_local;
  Compiler *compiler_local;
  
  __end1 = spirv_cross::VectorView<spirv_cross::Resource>::begin
                     (&res->super_VectorView<spirv_cross::Resource>);
  pRVar3 = spirv_cross::VectorView<spirv_cross::Resource>::end
                     (&res->super_VectorView<spirv_cross::Resource>);
  for (; __end1 != pRVar3; __end1 = __end1 + 1) {
    ranges.stack_storage.aligned_char._184_8_ = __end1;
    local_114 = (uint32_t)spirv_cross::TypedID::operator_cast_to_TypedID((TypedID *)__end1);
    spirv_cross::Compiler::get_active_buffer_ranges
              ((SmallVector<spirv_cross::BufferRange,_8UL> *)local_110,compiler,
               (VariableID)local_114);
    pFVar2 = _stderr;
    uVar4 = std::__cxx11::string::empty();
    __range2._3_1_ = 0;
    if ((uVar4 & 1) == 0) {
      local_1c0 = std::__cxx11::string::c_str();
    }
    else {
      local_13c = *(uint *)ranges.stack_storage.aligned_char._184_8_;
      (*compiler->_vptr_Compiler[3])(local_138,compiler,(ulong)local_13c);
      __range2._3_1_ = 1;
      local_1c0 = std::__cxx11::string::c_str();
    }
    fprintf(pFVar2,"Active members in buffer: %s\n",local_1c0);
    if ((__range2._3_1_ & 1) != 0) {
      std::__cxx11::string::~string(local_138);
    }
    fprintf(_stderr,"==================\n\n");
    __begin2 = (BufferRange *)local_110;
    __end2 = spirv_cross::VectorView<spirv_cross::BufferRange>::begin
                       ((VectorView<spirv_cross::BufferRange> *)__begin2);
    range = spirv_cross::VectorView<spirv_cross::BufferRange>::end
                      ((VectorView<spirv_cross::BufferRange> *)__begin2);
    for (; __end2 != range; __end2 = __end2 + 1) {
      name = (string *)__end2;
      local_17c = *(uint32_t *)(ranges.stack_storage.aligned_char._184_8_ + 8);
      local_178 = spirv_cross::Compiler::get_member_name_abi_cxx11_
                            (compiler,(TypeID)local_17c,__end2->index);
      pFVar2 = _stderr;
      uVar1 = *(uint *)name;
      uVar4 = std::__cxx11::string::empty();
      bVar5 = (uVar4 & 1) != 0;
      if (bVar5) {
        (*compiler->_vptr_Compiler[5])(local_1a0,compiler,(ulong)*(uint *)name);
        local_1e0 = std::__cxx11::string::c_str();
      }
      else {
        local_1e0 = std::__cxx11::string::c_str();
      }
      fprintf(pFVar2,"Member #%3u (%s): Offset: %4u, Range: %4u\n",(ulong)uVar1,local_1e0,
              *(ulong *)(name + 8) & 0xffffffff,*(ulong *)(name + 0x10) & 0xffffffff);
      if (bVar5) {
        std::__cxx11::string::~string(local_1a0);
      }
    }
    fprintf(_stderr,"==================\n\n");
    spirv_cross::SmallVector<spirv_cross::BufferRange,_8UL>::~SmallVector
              ((SmallVector<spirv_cross::BufferRange,_8UL> *)local_110);
  }
  return;
}

Assistant:

static void print_push_constant_resources(const Compiler &compiler, const SmallVector<Resource> &res)
{
	for (auto &block : res)
	{
		auto ranges = compiler.get_active_buffer_ranges(block.id);
		fprintf(stderr, "Active members in buffer: %s\n",
		        !block.name.empty() ? block.name.c_str() : compiler.get_fallback_name(block.id).c_str());

		fprintf(stderr, "==================\n\n");
		for (auto &range : ranges)
		{
			const auto &name = compiler.get_member_name(block.base_type_id, range.index);

			fprintf(stderr, "Member #%3u (%s): Offset: %4u, Range: %4u\n", range.index,
			        !name.empty() ? name.c_str() : compiler.get_fallback_member_name(range.index).c_str(),
			        unsigned(range.offset), unsigned(range.range));
		}
		fprintf(stderr, "==================\n\n");
	}
}